

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

Ivy_Man_t * Ivy_FraigMiter(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  Ivy_Man_t *pIVar1;
  int iVar2;
  abctime aVar3;
  Ivy_FraigMan_t *p_00;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *p1;
  Vec_Ptr_t *pVVar6;
  abctime aVar7;
  abctime clk;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pManAigNew;
  Ivy_FraigMan_t *p;
  Ivy_FraigParams_t *pParams_local;
  Ivy_Man_t *pManAig_local;
  
  aVar3 = Abc_Clock();
  iVar2 = Ivy_ManLatchNum(pManAig);
  if (iVar2 == 0) {
    p_00 = Ivy_FraigStartSimple(pManAig,pParams);
    p_00->nBTLimitGlobal = s_nBTLimitGlobal;
    p_00->nInsLimitGlobal = s_nInsLimitGlobal;
    for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(p_00->pManAig->vObjs), clk._4_4_ < iVar2;
        clk._4_4_ = clk._4_4_ + 1) {
      pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(p_00->pManAig->vObjs,clk._4_4_);
      if ((pIVar4 != (Ivy_Obj_t *)0x0) && (iVar2 = Ivy_ObjIsNode(pIVar4), iVar2 != 0)) {
        pIVar1 = p_00->pManFraig;
        pIVar5 = Ivy_ObjChild0Equiv(pIVar4);
        p1 = Ivy_ObjChild1Equiv(pIVar4);
        pIVar5 = Ivy_And(pIVar1,pIVar5,p1);
        pIVar4->pEquiv = pIVar5;
      }
    }
    Ivy_FraigMiterProve(p_00);
    for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(p_00->pManAig->vPos), clk._4_4_ < iVar2;
        clk._4_4_ = clk._4_4_ + 1) {
      pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(p_00->pManAig->vPos,clk._4_4_);
      pIVar1 = p_00->pManFraig;
      pIVar4 = Ivy_ObjChild0Equiv(pIVar4);
      Ivy_ObjCreatePo(pIVar1,pIVar4);
    }
    for (clk._4_4_ = 0; iVar2 = Vec_PtrSize(p_00->pManFraig->vObjs), clk._4_4_ < iVar2;
        clk._4_4_ = clk._4_4_ + 1) {
      pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(p_00->pManFraig->vObjs,clk._4_4_);
      if (pIVar4 != (Ivy_Obj_t *)0x0) {
        pVVar6 = Ivy_ObjFaninVec(pIVar4);
        if (pVVar6 != (Vec_Ptr_t *)0x0) {
          pVVar6 = Ivy_ObjFaninVec(pIVar4);
          Vec_PtrFree(pVVar6);
        }
        pIVar4->pNextFan1 = (Ivy_Obj_t *)0x0;
        pIVar4->pNextFan0 = (Ivy_Obj_t *)0x0;
      }
    }
    Ivy_ManCleanup(p_00->pManFraig);
    pIVar1 = p_00->pManFraig;
    aVar7 = Abc_Clock();
    p_00->timeTotal = aVar7 - aVar3;
    Ivy_FraigStop(p_00);
    return pIVar1;
  }
  __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x1e8,"Ivy_Man_t *Ivy_FraigMiter(Ivy_Man_t *, Ivy_FraigParams_t *)");
}

Assistant:

Ivy_Man_t * Ivy_FraigMiter( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_Man_t * pManAigNew;
    Ivy_Obj_t * pObj;
    int i;
    abctime clk;
clk = Abc_Clock();
    assert( Ivy_ManLatchNum(pManAig) == 0 );
    p = Ivy_FraigStartSimple( pManAig, pParams );
    // set global limits
    p->nBTLimitGlobal  = s_nBTLimitGlobal;
    p->nInsLimitGlobal = s_nInsLimitGlobal; 
    // duplicate internal nodes
    Ivy_ManForEachNode( p->pManAig, pObj, i )
        pObj->pEquiv = Ivy_And( p->pManFraig, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
    // try to prove each output of the miter
    Ivy_FraigMiterProve( p );
    // add the POs
    Ivy_ManForEachPo( p->pManAig, pObj, i )
        Ivy_ObjCreatePo( p->pManFraig, Ivy_ObjChild0Equiv(pObj) );
    // clean the new manager
    Ivy_ManForEachObj( p->pManFraig, pObj, i )
    {
        if ( Ivy_ObjFaninVec(pObj) )
            Vec_PtrFree( Ivy_ObjFaninVec(pObj) );
        pObj->pNextFan0 = pObj->pNextFan1 = NULL;
    }
    // remove dangling nodes 
    Ivy_ManCleanup( p->pManFraig );
    pManAigNew = p->pManFraig;
p->timeTotal = Abc_Clock() - clk;

//printf( "Final nodes = %6d. ", Ivy_ManNodeNum(pManAigNew) );
//ABC_PRT( "Time", p->timeTotal );
    Ivy_FraigStop( p );
    return pManAigNew;
}